

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::processAttributes
          (TraverseSchema *this,DOMElement *elem,DOMElement *attElem,ComplexTypeInfo *typeInfo,
          bool isBaseAnyType)

{
  DefAttTypes DVar1;
  ComplexTypeInfo *baseTypeInfo;
  QName *pQVar2;
  XMLSize_t XVar3;
  SchemaAttDef *pSVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  XMLCh *pXVar8;
  XercesAttGroupInfo **ppXVar9;
  SchemaAttDef *pSVar10;
  SchemaAttDef *pSVar11;
  XMLAttDefList *pXVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SchemaAttDef *pSVar13;
  undefined4 *puVar14;
  char cVar15;
  undefined7 in_register_00000081;
  XMLSize_t getAt;
  ulong uVar16;
  bool bVar17;
  SchemaAttDef *local_98;
  SchemaAttDef *local_90;
  SchemaAttDef *local_88;
  DefAttTypes local_7c;
  XercesAttGroupInfo *attGroupInfo;
  undefined4 local_5c;
  ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> attGroupList;
  undefined4 extraout_var_00;
  
  if (typeInfo == (ComplexTypeInfo *)0x0) {
    return;
  }
  local_5c = (undefined4)CONCAT71(in_register_00000081,isBaseAnyType);
  baseTypeInfo = typeInfo->fBaseComplexTypeInfo;
  if ((baseTypeInfo != (ComplexTypeInfo *)0x0) && (baseTypeInfo->fPreprocessed == true)) {
    puVar14 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar14 = 2;
    __cxa_throw(puVar14,&ExceptionCodes::typeinfo,0);
  }
  attGroupInfo = (XercesAttGroupInfo *)0x0;
  attGroupList.fMemoryManager = this->fGrammarPoolMemoryManager;
  attGroupList.fCallDestructor = false;
  attGroupList.fCurCount = 0;
  attGroupList.fMaxCount = 4;
  attGroupList.fElemList = (XercesAttGroupInfo **)0x0;
  iVar6 = (*(attGroupList.fMemoryManager)->_vptr_MemoryManager[3])(attGroupList.fMemoryManager,0x20)
  ;
  attGroupList.fElemList = (XercesAttGroupInfo **)CONCAT44(extraout_var,iVar6);
  *attGroupList.fElemList = (XercesAttGroupInfo *)0x0;
  attGroupList.fElemList[1] = (XercesAttGroupInfo *)0x0;
  attGroupList.fElemList[2] = (XercesAttGroupInfo *)0x0;
  attGroupList.fElemList[3] = (XercesAttGroupInfo *)0x0;
  local_98 = (SchemaAttDef *)0x0;
  local_88 = (SchemaAttDef *)0x0;
  for (; XVar3 = attGroupList.fCurCount, &attElem->super_DOMNode != (DOMNode *)0x0;
      attElem = XUtil::getNextSiblingElement(&attElem->super_DOMNode)) {
    iVar6 = (*(attElem->super_DOMNode)._vptr_DOMNode[0x18])(attElem);
    pXVar8 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
    bVar5 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_ATTRIBUTE);
    pSVar11 = local_98;
    if (bVar5) {
      if (local_88 != (SchemaAttDef *)0x0) {
        reportSchemaError(this,attElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x99);
      }
      traverseAttributeDecl(this,attElem,typeInfo,false);
    }
    else {
      bVar5 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP);
      if (bVar5) {
        if (local_88 != (SchemaAttDef *)0x0) {
          reportSchemaError(this,attElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x99);
        }
        attGroupInfo = traverseAttributeGroupDecl(this,attElem,typeInfo,false);
        if ((attGroupInfo != (XercesAttGroupInfo *)0x0) &&
           (bVar5 = ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::containsElement
                              (&attGroupList,&attGroupInfo,0), !bVar5)) {
          ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::addElement(&attGroupList,&attGroupInfo);
        }
      }
      else {
        bVar5 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgELT_ANYATTRIBUTE);
        if (bVar5) {
          if (local_88 != (SchemaAttDef *)0x0) {
            reportSchemaError(this,attElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x98);
          }
          local_88 = traverseAnyAttribute(this,attElem);
          pSVar11 = local_88;
          if (local_98 != (SchemaAttDef *)0x0) {
            (*(local_98->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
          }
        }
        else {
          reportSchemaError(this,attElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x2a,pXVar8,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
    }
    local_98 = pSVar11;
  }
  iVar6 = typeInfo->fDerivedBy;
  if (attGroupList.fCurCount != 0) {
    pSVar13 = (SchemaAttDef *)0x0;
    bVar5 = false;
    local_7c = DefAttTypes_Min;
    pSVar11 = (SchemaAttDef *)0x0;
    for (getAt = 0; XVar3 != getAt; getAt = getAt + 1) {
      ppXVar9 = ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::elementAt(&attGroupList,getAt);
      attGroupInfo = *ppXVar9;
      pSVar4 = pSVar13;
      if ((attGroupInfo->fAnyAttributes != (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) &&
         ((attGroupInfo->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fCurCount
          != 0)) {
        if (!bVar5) {
          if (local_88 == (SchemaAttDef *)0x0) {
            pSVar10 = XercesAttGroupInfo::anyAttributeAt(attGroupInfo,0);
            local_7c = (pSVar10->super_XMLAttDef).fDefaultType;
          }
          else {
            local_7c = (local_88->super_XMLAttDef).fDefaultType;
          }
        }
        pSVar10 = attGroupInfo->fCompleteWildCard;
        if (pSVar11 == (SchemaAttDef *)0x0) {
          pSVar11 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          SchemaAttDef::SchemaAttDef(pSVar11,pSVar10);
          bVar5 = true;
          pSVar4 = pSVar11;
          if (pSVar13 != (SchemaAttDef *)0x0) {
            (*(pSVar13->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])(pSVar13);
          }
        }
        else {
          bVar5 = true;
          attWildCardIntersection(this,pSVar11,pSVar10);
        }
      }
      pSVar13 = pSVar4;
    }
    if (pSVar11 != (SchemaAttDef *)0x0) {
      if (local_88 == (SchemaAttDef *)0x0) {
        if (local_98 != (SchemaAttDef *)0x0) {
          (*(local_98->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])(local_98);
        }
        pSVar13 = (SchemaAttDef *)0x0;
        local_98 = pSVar11;
      }
      else {
        attWildCardIntersection(this,local_88,pSVar11);
        pSVar11 = local_88;
      }
      (pSVar11->super_XMLAttDef).fDefaultType = local_7c;
      local_88 = pSVar11;
    }
    if (pSVar13 != (SchemaAttDef *)0x0) {
      (*(pSVar13->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])(pSVar13);
    }
  }
  if (baseTypeInfo == (ComplexTypeInfo *)0x0) {
    pSVar11 = (SchemaAttDef *)0x0;
  }
  else {
    pSVar11 = baseTypeInfo->fAttWildCard;
  }
  cVar15 = (char)local_5c;
  if (iVar6 == 2) {
    if (cVar15 == '\0') {
      local_90 = (SchemaAttDef *)0x0;
    }
    else {
      local_90 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
      SchemaAttDef::SchemaAttDef
                (local_90,L"",L"",this->fEmptyNamespaceURI,Any_Any,ProcessContents_Lax,
                 this->fGrammarPoolMemoryManager);
      pSVar11 = local_90;
    }
    if ((pSVar11 == (SchemaAttDef *)0x0) || (local_88 == (SchemaAttDef *)0x0)) goto LAB_0031cec8;
    DVar1 = (local_88->super_XMLAttDef).fDefaultType;
    attWildCardUnion(this,local_88,pSVar11);
    (local_88->super_XMLAttDef).fDefaultType = DVar1;
  }
  else {
    local_90 = (SchemaAttDef *)0x0;
LAB_0031cec8:
    if (local_88 == (SchemaAttDef *)0x0) {
      if ((iVar6 == 2) && (pSVar11 != (SchemaAttDef *)0x0)) {
        if (cVar15 == '\0') {
          pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          SchemaAttDef::SchemaAttDef(pSVar13,pSVar11);
          if (typeInfo->fAttWildCard != (SchemaAttDef *)0x0) {
            (*(typeInfo->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])
                      ();
          }
          typeInfo->fAttWildCard = pSVar13;
        }
        else {
          if (typeInfo->fAttWildCard != (SchemaAttDef *)0x0) {
            (*(typeInfo->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])
                      ();
          }
          typeInfo->fAttWildCard = pSVar11;
          local_90 = (SchemaAttDef *)0x0;
        }
      }
      goto LAB_0031cfe2;
    }
  }
  if (typeInfo->fAttWildCard != (SchemaAttDef *)0x0) {
    (*(typeInfo->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
  }
  typeInfo->fAttWildCard = local_88;
  if ((local_88->super_XMLAttDef).fType == AttTypes_Unknown) {
    local_98 = (SchemaAttDef *)0x0;
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6c);
  }
  else {
    local_98 = (SchemaAttDef *)0x0;
  }
LAB_0031cfe2:
  if (baseTypeInfo == (ComplexTypeInfo *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = baseTypeInfo->fAttDefs->fCount != 0;
  }
  if (typeInfo->fAttDefs->fCount == 0) {
    bVar17 = typeInfo->fAttWildCard == (SchemaAttDef *)0x0;
  }
  else {
    bVar17 = false;
  }
  if ((iVar6 == 4) && (!bVar17)) {
    if (pSVar11 == (SchemaAttDef *)0x0 && !bVar5) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6d);
    }
    else {
      checkAttDerivationOK(this,elem,baseTypeInfo,typeInfo);
    }
  }
  if ((baseTypeInfo != (ComplexTypeInfo *)0x0) && (baseTypeInfo->fAttDefs->fCount != 0)) {
    pXVar12 = ComplexTypeInfo::getAttDefList(baseTypeInfo);
    for (uVar16 = 0; iVar7 = (*(pXVar12->super_XSerializable)._vptr_XSerializable[10])(pXVar12),
        uVar16 < CONCAT44(extraout_var_01,iVar7); uVar16 = uVar16 + 1) {
      iVar7 = (*(pXVar12->super_XSerializable)._vptr_XSerializable[0xb])(pXVar12,uVar16);
      pSVar11 = (SchemaAttDef *)CONCAT44(extraout_var_02,iVar7);
      pQVar2 = pSVar11->fAttName;
      pXVar8 = pQVar2->fLocalPart;
      pSVar13 = ComplexTypeInfo::getAttDef(typeInfo,pXVar8,pQVar2->fURIId);
      if (pSVar13 == (SchemaAttDef *)0x0) {
        if ((pSVar11->super_XMLAttDef).fDefaultType != DefAttTypes_Max) {
          pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          SchemaAttDef::SchemaAttDef
                    (pSVar13,pQVar2->fPrefix,pQVar2->fLocalPart,pQVar2->fURIId,
                     (pSVar11->super_XMLAttDef).fValue,(pSVar11->super_XMLAttDef).fType,
                     (pSVar11->super_XMLAttDef).fDefaultType,(pSVar11->super_XMLAttDef).fEnumeration
                     ,this->fGrammarPoolMemoryManager);
          pSVar13->fDatatypeValidator = pSVar11->fDatatypeValidator;
          ComplexTypeInfo::addAttDef(typeInfo,pSVar13);
          if (pSVar11->fBaseAttDecl != (SchemaAttDef *)0x0) {
            pSVar11 = pSVar11->fBaseAttDecl;
          }
          pSVar13->fBaseAttDecl = pSVar11;
        }
      }
      else if (iVar6 == 2) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6b,pXVar8,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
  }
  if (local_90 != (SchemaAttDef *)0x0) {
    (*(local_90->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
  }
  ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::~ValueVectorOf(&attGroupList);
  if (local_98 != (SchemaAttDef *)0x0) {
    (*(local_98->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])(local_98);
  }
  return;
}

Assistant:

void TraverseSchema::processAttributes(const DOMElement* const elem,
                                       const DOMElement* const attElem,
                                       ComplexTypeInfo* const typeInfo,
                                       const bool isBaseAnyType) {

    // If we do not have a complexTypeInfo, then what is the point of
    // processing.
    if (typeInfo == 0) {
        return;
    }

    ComplexTypeInfo* baseTypeInfo = typeInfo->getBaseComplexTypeInfo();
    if (baseTypeInfo && baseTypeInfo->getPreprocessed())
        throw TraverseSchema::RecursingElement;

    const DOMElement* child = attElem;
    SchemaAttDef* attWildCard = 0;
    Janitor<SchemaAttDef> janAttWildCard(0);
    XercesAttGroupInfo* attGroupInfo = 0;
    ValueVectorOf<XercesAttGroupInfo*> attGroupList(4, fGrammarPoolMemoryManager);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* childName = child->getLocalName();

        if (XMLString::equals(childName, SchemaSymbols::fgELT_ATTRIBUTE)) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeBeforeAttribute);

            traverseAttributeDecl(child, typeInfo);
        }
        else if (XMLString::equals(childName, SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeBeforeAttribute);

            attGroupInfo = traverseAttributeGroupDecl(child, typeInfo);
            if (attGroupInfo && !attGroupList.containsElement(attGroupInfo)) {
                attGroupList.addElement(attGroupInfo);
            }
        }
        else if (XMLString::equals(childName, SchemaSymbols::fgELT_ANYATTRIBUTE) ) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAnyAttribute);

            attWildCard = traverseAnyAttribute(child);
            janAttWildCard.reset(attWildCard);
        }
        else {
            reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildInComplexType, childName);
        }
    }

    // -------------------------------------------------------------
    // Handle wild card/any attribute
    // -------------------------------------------------------------
    int derivedBy = typeInfo->getDerivedBy();
    XMLSize_t attGroupListSize = attGroupList.size();

    if (attGroupListSize) {

        SchemaAttDef* completeWildCard = 0;
        Janitor<SchemaAttDef> janCompleteWildCard(0);
        XMLAttDef::DefAttTypes defAttType = XMLAttDef::Default;
        bool defAttTypeSet = false;

        for (XMLSize_t i=0; i < attGroupListSize; i++) {

            attGroupInfo = attGroupList.elementAt(i);
            XMLSize_t anyAttCount = attGroupInfo->anyAttributeCount();

            if (anyAttCount) {

                if (!defAttTypeSet) {

                    defAttType = (attWildCard) ? attWildCard->getDefaultType()
                                               : attGroupInfo->anyAttributeAt(0)->getDefaultType();
                    defAttTypeSet = true;
                }

                SchemaAttDef* attGroupWildCard = attGroupInfo->getCompleteWildCard();
                if (completeWildCard) {
                    attWildCardIntersection(completeWildCard, attGroupWildCard);
                }
                else {
                    completeWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(attGroupWildCard);
                    janCompleteWildCard.reset(completeWildCard);
                }
            }

        }

        if (completeWildCard) {

            if (attWildCard) {
                attWildCardIntersection(attWildCard, completeWildCard);
            }
            else {

                attWildCard = completeWildCard;
                janCompleteWildCard.orphan();
                janAttWildCard.reset(attWildCard);
            }

            attWildCard->setDefaultType(defAttType);
        }
    }

    SchemaAttDef* baseAttWildCard = (baseTypeInfo) ? baseTypeInfo->getAttWildCard() : 0;
    Janitor<SchemaAttDef> janBaseAttWildCard(0);

    if (derivedBy == SchemaSymbols::XSD_EXTENSION) {

        if (isBaseAnyType) {

            baseAttWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(XMLUni::fgZeroLenString,
                                               XMLUni::fgZeroLenString,
                                               fEmptyNamespaceURI, XMLAttDef::Any_Any,
                                               XMLAttDef::ProcessContents_Lax,
                                               fGrammarPoolMemoryManager);
            janBaseAttWildCard.reset(baseAttWildCard);
        }

        if (baseAttWildCard && attWildCard) {

            XMLAttDef::DefAttTypes saveDefType = attWildCard->getDefaultType();
            attWildCardUnion(attWildCard, baseAttWildCard);
            attWildCard->setDefaultType(saveDefType);
        }
    }

    // -------------------------------------------------------------
    // insert wildcard attribute
    // -------------------------------------------------------------
    if (attWildCard) {

        typeInfo->setAttWildCard(attWildCard);
        janAttWildCard.orphan();

        if (attWildCard->getType() == XMLAttDef::AttTypes_Unknown) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotExpressibleWildCardIntersection);
        }
    }
    else if (baseAttWildCard && derivedBy == SchemaSymbols::XSD_EXTENSION) {

        if (isBaseAnyType) {

            typeInfo->setAttWildCard(baseAttWildCard);
            janBaseAttWildCard.orphan();
        }
        else {

            SchemaAttDef* newWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(baseAttWildCard);
            typeInfo->setAttWildCard(newWildCard);
        }
    }

    // -------------------------------------------------------------
    // Check attributes derivation OK
    // -------------------------------------------------------------
    bool baseWithAttributes = (baseTypeInfo && baseTypeInfo->hasAttDefs());
    bool childWithAttributes = (typeInfo->hasAttDefs() || typeInfo->getAttWildCard());

    if (derivedBy == SchemaSymbols::XSD_RESTRICTION && childWithAttributes) {

        if (!baseWithAttributes && !baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_1);
        }
        else {
            checkAttDerivationOK(elem, baseTypeInfo, typeInfo);
        }
    }

    // -------------------------------------------------------------
    // merge in base type's attribute decls
    // -------------------------------------------------------------
    if (baseTypeInfo && baseTypeInfo->hasAttDefs()) {

        SchemaAttDefList& baseAttList = (SchemaAttDefList&)
                                        baseTypeInfo->getAttDefList();

        for (XMLSize_t i=0; i<baseAttList.getAttDefCount(); i++) {

            SchemaAttDef& attDef = (SchemaAttDef&) baseAttList.getAttDef(i);
            QName* attName = attDef.getAttName();
            const XMLCh* localPart = attName->getLocalPart();

            // if found a duplicate, then skip the one from the base type
            if (typeInfo->getAttDef(localPart, attName->getURI()) != 0) {

                if (derivedBy == SchemaSymbols::XSD_EXTENSION) {
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttInDerivation, localPart);
                }

                continue;
            }

            if (attDef.getDefaultType() != XMLAttDef::Prohibited) {

                SchemaAttDef* newAttDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attName->getPrefix(),
                                                           attName->getLocalPart(),
                                                           attName->getURI(),
                                                           attDef.getValue(),
                                                           attDef.getType(),
                                                           attDef.getDefaultType(),
                                                           attDef.getEnumeration(),
                                                           fGrammarPoolMemoryManager);

                newAttDef->setDatatypeValidator(attDef.getDatatypeValidator());
                typeInfo->addAttDef(newAttDef);

                if (attDef.getBaseAttDecl())
                    newAttDef->setBaseAttDecl(attDef.getBaseAttDecl());
                else
                    newAttDef->setBaseAttDecl(&attDef);
            }
        }
    }
}